

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

BailOutKind IR::EquivalentToMonoTypeCheckBailOutKind(BailOutKind kind)

{
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  undefined4 *puVar4;
  BailOutKind local_c;
  BailOutKind kind_local;
  
  BVar3 = operator~(BailOutKindBits);
  BVar3 = operator&(kind,BVar3);
  if (BVar3 == BailOutFailedEquivalentTypeCheck) {
    BVar3 = operator&(kind,BailOutKindBits);
    local_c = operator|(BailOutFailedTypeCheck,BVar3);
  }
  else if (BVar3 == BailOutFailedEquivalentFixedFieldTypeCheck) {
    BVar3 = operator&(kind,BailOutKindBits);
    local_c = operator|(BailOutFailedFixedFieldTypeCheck,BVar3);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                       ,0xa8a,"(0)","0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    local_c = BailOutInvalid;
  }
  return local_c;
}

Assistant:

IR::BailOutKind IR::EquivalentToMonoTypeCheckBailOutKind(IR::BailOutKind kind)
{
    switch (kind & ~IR::BailOutKindBits)
    {
    case IR::BailOutFailedEquivalentTypeCheck:
        return IR::BailOutFailedTypeCheck | (kind & IR::BailOutKindBits);

    case IR::BailOutFailedEquivalentFixedFieldTypeCheck:
        return IR::BailOutFailedFixedFieldTypeCheck | (kind & IR::BailOutKindBits);

    default:
        Assert(0);
        return IR::BailOutInvalid;
    }
}